

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O2

void av1_setup_src_planes
               (MACROBLOCK *x,YV12_BUFFER_CONFIG *src,int mi_row,int mi_col,int num_planes,
               BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  int y;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int x_1;
  uint uVar9;
  int *piVar10;
  ulong uVar11;
  
  (x->e_mbd).cur_buf = src;
  uVar7 = 3;
  if (num_planes < 3) {
    uVar7 = num_planes;
  }
  uVar6 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar6;
  }
  piVar10 = &(x->e_mbd).plane[0].subsampling_y;
  piVar5 = &x->plane[0].src.stride;
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    uVar11 = (ulong)(uVar6 != 0);
    puVar4 = src->store_buf_adr[uVar6 - 4];
    uVar7 = (uint)((0x20005UL >> ((ulong)bsize & 0x3f) & 1) != 0);
    if (*piVar10 == 0) {
      uVar7 = 0;
    }
    uVar9 = (uint)((0x10003UL >> ((ulong)bsize & 0x3f) & 1) != 0);
    if (piVar10[-1] == 0) {
      uVar9 = 0;
    }
    iVar1 = *(int *)((long)src->store_buf_adr + uVar11 * 4 + -0x28);
    iVar2 = *(int *)((long)src->store_buf_adr + uVar11 * 4 + -0x38);
    iVar3 = *(int *)((long)src->store_buf_adr + uVar11 * 4 + -0x30);
    ((buf_2d *)(piVar5 + -6))->buf =
         puVar4 + (long)((int)((~uVar7 & mi_row) << 2) >> ((byte)*piVar10 & 0x1f)) * (long)iVar1 +
                  (long)((int)((~uVar9 & mi_col) << 2) >> ((byte)piVar10[-1] & 0x1f));
    *(uint8_t **)(piVar5 + -4) = puVar4;
    piVar5[-2] = iVar2;
    piVar5[-1] = iVar3;
    *piVar5 = iVar1;
    piVar10 = piVar10 + 0x28c;
    piVar5 = piVar5 + 0x22;
  }
  return;
}

Assistant:

void av1_setup_src_planes(MACROBLOCK *x, const YV12_BUFFER_CONFIG *src,
                          int mi_row, int mi_col, const int num_planes,
                          BLOCK_SIZE bsize) {
  // Set current frame pointer.
  x->e_mbd.cur_buf = src;

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); i++) {
    const int is_uv = i > 0;
    setup_pred_plane(
        &x->plane[i].src, bsize, src->buffers[i], src->crop_widths[is_uv],
        src->crop_heights[is_uv], src->strides[is_uv], mi_row, mi_col, NULL,
        x->e_mbd.plane[i].subsampling_x, x->e_mbd.plane[i].subsampling_y);
  }
}